

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O3

void mathCore::do_simplification(expression *a)

{
  const_iterator cVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  undefined4 extraout_var;
  expression *peVar6;
  expression *src;
  expression *dst;
  expSet *this;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar7;
  expression *child;
  expression *local_30;
  _Alloc_node local_28;
  
  bVar3 = is_and(a);
  if (bVar3) {
    combine_and(a);
    cVar1._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    peVar6 = *(expression **)(cVar1._M_node + 1);
    local_30 = peVar6;
    iVar5 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                *)&a->contents,cVar1);
    bVar3 = is_or(peVar6);
  }
  else {
    bVar3 = is_or(a);
    if (!bVar3) {
      return;
    }
    combine_or(a);
    cVar1._M_node = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    peVar6 = *(expression **)(cVar1._M_node + 1);
    local_30 = peVar6;
    iVar5 = std::
            _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
            ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                *)&a->contents,cVar1);
    bVar3 = is_and(peVar6);
  }
  this = &a->contents;
  if (bVar3 == false) {
    return;
  }
  src = peVar6;
  absorbtion_law(a,peVar6);
  bVar3 = is_literal(peVar6);
  if ((bVar3) || (bVar3 = is_var(peVar6), bVar3)) goto LAB_00109b56;
  uVar2 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  dst = a;
  if (uVar2 < 2) {
    if (uVar2 == 1) {
      dst = *(expression **)(iVar5._M_node + 1);
      goto LAB_00109b3b;
    }
  }
  else {
LAB_00109b3b:
    iVar4 = copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src);
    distributive_law(a,peVar6,(expression *)CONCAT44(extraout_var,iVar4));
  }
  delete_children(a);
LAB_00109b56:
  pVar7 = std::
          _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
          ::_M_get_insert_equal_pos(&this->_M_t,&local_30);
  peVar6 = (expression *)pVar7.first;
  local_28._M_t = &this->_M_t;
  std::
  _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
  ::
  _M_insert_<expression*const&,std::_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>::_Alloc_node>
            ((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
              *)this,(_Base_ptr)peVar6,pVar7.second,&local_30,&local_28);
  empty_expression((mathCore *)a,peVar6);
  return;
}

Assistant:

void mathCore::do_simplification(expression* a) {
	if (is_and(a)) {
		combine_and(a);

		auto iter = a->contents.begin();
		expression* child = *iter;
		iter = a->contents.erase(iter);	// Pop it!

		if (is_or(child)) {
			absorbtion_law(a, child);

			if (is_literal(child) || is_var(child)) {
				a->contents.insert(child); // Insert it back if its simple
			}
			else {
				// a is our original parent and where the answer needs to go, so we can't distribute it
				// we distribute a copy!
				if (a->contents.size() > 1) {
					distributive_law(a, child, mathCore::copy(a));
				}
				else if (a->contents.size() == 1) {
					distributive_law(a, child, mathCore::copy(*iter));	// Single variables distribute easily
				}

				delete_children(a);	// Remove everything from a
				a->contents.insert(child);	// Put in us!
			}
			empty_expression(a);
		}
	}
	else if (is_or(a)) {
		combine_or(a);

		auto iter = a->contents.begin();
		expression* child = *iter;
		iter = a->contents.erase(iter);	// Pop it!

		if (is_and(child)) {
			absorbtion_law(a, child);

			if (is_literal(child) || is_var(child)) {
				a->contents.insert(child); // Insert it back if its simple
			}
			else {
				// a is our original parent and where the answer needs to go, so we can't distribute it
				// we distribute a copy!
				if (a->contents.size() > 1) {
					distributive_law(a, child, mathCore::copy(a));
				}
				else if (a->contents.size() == 1) {
					distributive_law(a, child, mathCore::copy(*iter));	// Single variables distribute easily
				}

				
				delete_children(a);	// Remove everything from a
				a->contents.insert(child);
			}
			empty_expression(a);
		}
	}
}